

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O3

void secp256k1_ecmult_strauss_wnaf
               (secp256k1_strauss_state *state,secp256k1_gej *r,size_t num,secp256k1_gej *a,
               secp256k1_scalar *na,secp256k1_scalar *ng)

{
  undefined1 *puVar1;
  secp256k1_strauss_point_state *psVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined4 extraout_EAX;
  int iVar40;
  uint uVar41;
  uint uVar42;
  uint32_t uVar43;
  uint uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  secp256k1_gej *psVar49;
  secp256k1_gej *psVar50;
  secp256k1_gej *r_00;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  secp256k1_gej *extraout_RDX;
  secp256k1_fe *extraout_RDX_00;
  secp256k1_fe *extraout_RDX_01;
  secp256k1_scalar *r_01;
  secp256k1_gej *psVar56;
  secp256k1_scalar *r_02;
  long lVar57;
  secp256k1_gej *psVar58;
  secp256k1_gej *psVar59;
  undefined1 *puVar60;
  secp256k1_gej *psVar61;
  uint64_t *puVar62;
  secp256k1_gej *psVar63;
  secp256k1_fe *psVar64;
  secp256k1_gej *r_03;
  secp256k1_fe *r_04;
  ulong uVar65;
  ulong uVar66;
  ulong uVar67;
  ulong uVar68;
  ulong uVar69;
  secp256k1_gej *psVar70;
  ulong uVar71;
  ulong uVar72;
  ulong uVar73;
  ulong uVar74;
  ulong uVar75;
  ulong uVar76;
  long lVar77;
  secp256k1_ge *psVar78;
  uint uVar79;
  secp256k1_fe *psVar80;
  undefined1 uVar81;
  bool bVar82;
  byte bVar83;
  undefined1 auVar84 [16];
  secp256k1_scalar na_lam;
  secp256k1_fe Z;
  secp256k1_scalar ng_128;
  secp256k1_scalar ng_1;
  int wnaf_ng_128 [129];
  int wnaf_ng_1 [129];
  secp256k1_fe sStack_988;
  secp256k1_fe sStack_950;
  secp256k1_fe sStack_920;
  secp256k1_gej *psStack_8f0;
  secp256k1_gej *psStack_8e8;
  secp256k1_gej *psStack_8e0;
  secp256k1_gej *psStack_8d8;
  secp256k1_gej *psStack_8d0;
  secp256k1_gej *psStack_8c8;
  secp256k1_gej *psStack_8b8;
  secp256k1_gej sStack_8b0;
  secp256k1_gej sStack_818;
  secp256k1_ge sStack_780;
  secp256k1_gej *psStack_718;
  secp256k1_gej *psStack_710;
  secp256k1_gej *psStack_708;
  secp256k1_gej *psStack_700;
  secp256k1_gej *psStack_6f8;
  secp256k1_gej *psStack_6f0;
  uint uStack_6dc;
  int iStack_6d8;
  uint uStack_6d4;
  secp256k1_gej *psStack_6d0;
  undefined1 auStack_6c8 [24];
  uint64_t uStack_6b0;
  secp256k1_gej *psStack_6a0;
  secp256k1_gej *psStack_698;
  secp256k1_gej *psStack_690;
  secp256k1_gej *psStack_688;
  secp256k1_gej *psStack_680;
  code *pcStack_678;
  secp256k1_gej *psStack_670;
  secp256k1_gej *psStack_668;
  undefined1 auStack_660 [64];
  byte abStack_620 [32];
  byte abStack_600 [32];
  undefined1 auStack_5e0 [16];
  uint64_t uStack_5d0;
  uint64_t uStack_5c8;
  undefined1 auStack_5c0 [16];
  uint64_t uStack_5b0;
  uint64_t uStack_5a8;
  secp256k1_gej *psStack_598;
  secp256k1_gej *psStack_590;
  secp256k1_gej *psStack_588;
  secp256k1_gej *psStack_580;
  secp256k1_gej *psStack_578;
  secp256k1_scalar *psStack_570;
  char local_559;
  secp256k1_gej *local_558;
  secp256k1_gej *local_550;
  secp256k1_gej *local_548;
  uint64_t *local_540;
  secp256k1_gej *local_538;
  long local_530;
  long local_528;
  secp256k1_ge local_520;
  undefined1 local_4b8 [24];
  undefined1 local_4a0 [16];
  undefined8 local_490;
  secp256k1_scalar local_488;
  secp256k1_scalar local_468;
  secp256k1_scalar local_448 [16];
  secp256k1_gej local_238 [3];
  
  bVar83 = 0;
  local_4b8._0_8_ = 1;
  local_4b8._8_16_ = (undefined1  [16])0x0;
  local_4a0 = (undefined1  [16])0x0;
  local_490._0_4_ = 1;
  local_490._4_4_ = 1;
  psStack_570 = (secp256k1_scalar *)0x145cb9;
  psVar49 = a;
  psVar70 = (secp256k1_gej *)na;
  local_540 = ng->d;
  local_538 = r;
  secp256k1_fe_verify((secp256k1_fe *)local_4b8);
  local_559 = '\x01';
  if (num == 0) {
    local_558 = (secp256k1_gej *)0x0;
  }
  else {
    psVar56 = (secp256k1_gej *)0x0;
    local_558 = (secp256k1_gej *)0x0;
    do {
      psVar59 = local_238;
      psStack_570 = (secp256k1_scalar *)0x145ce2;
      secp256k1_scalar_verify(na);
      auVar84._0_4_ =
           -(uint)((int)(((secp256k1_gej *)na)->x).n[2] == 0 &&
                  (int)(((secp256k1_gej *)na)->x).n[0] == 0);
      auVar84._4_4_ =
           -(uint)(*(int *)((long)(((secp256k1_gej *)na)->x).n + 0x14) == 0 &&
                  *(int *)((long)(((secp256k1_gej *)na)->x).n + 4) == 0);
      auVar84._8_4_ =
           -(uint)((int)(((secp256k1_gej *)na)->x).n[3] == 0 &&
                  (int)(((secp256k1_gej *)na)->x).n[1] == 0);
      auVar84._12_4_ =
           -(uint)(*(int *)((long)(((secp256k1_gej *)na)->x).n + 0x1c) == 0 &&
                  *(int *)((long)(((secp256k1_gej *)na)->x).n + 0xc) == 0);
      iVar40 = movmskps(extraout_EAX,auVar84);
      if (iVar40 != 0xf) {
        psStack_570 = (secp256k1_scalar *)0x145d0f;
        secp256k1_gej_verify(a);
        if (a->infinity == 0) {
          psStack_570 = (secp256k1_scalar *)0x145d32;
          secp256k1_scalar_split_lambda(local_448,(secp256k1_scalar *)&local_520,na);
          r_02 = (secp256k1_scalar *)((long)psVar56 * 0x410);
          psStack_570 = (secp256k1_scalar *)0x145d5c;
          local_548 = psVar56;
          iVar40 = secp256k1_ecmult_wnaf(state->ps[(long)psVar56].wnaf_na_1,0x81,local_448,5);
          psVar63 = (secp256k1_gej *)state->ps[(long)psVar56].wnaf_na_lam;
          state->ps[(long)psVar56].bits_na_1 = iVar40;
          psVar61 = (secp256k1_gej *)0x81;
          psStack_570 = (secp256k1_scalar *)0x145d85;
          uVar41 = secp256k1_ecmult_wnaf((int *)psVar63,0x81,(secp256k1_scalar *)&local_520,5);
          psVar2 = state->ps;
          psVar2[(long)psVar56].bits_na_lam = uVar41;
          uVar79 = psVar2[(long)psVar56].bits_na_1;
          psVar49 = (secp256k1_gej *)(ulong)uVar79;
          if (0x81 < (int)uVar79) goto LAB_00146361;
          if (0x81 < (int)uVar41) goto LAB_00146366;
          if ((int)uVar79 <= (int)local_558) {
            psVar49 = (secp256k1_gej *)((ulong)local_558 & 0xffffffff);
          }
          if ((int)psVar49 < (int)uVar41) {
            psVar49 = (secp256k1_gej *)(ulong)uVar41;
          }
          psStack_570 = (secp256k1_scalar *)0x145dd3;
          local_558 = psVar49;
          memcpy(psVar59,a,0x98);
          psVar56 = local_548;
          psVar49 = (secp256k1_gej *)local_4b8;
          if (local_548 != (secp256k1_gej *)0x0) {
            psStack_570 = (secp256k1_scalar *)0x145df3;
            secp256k1_gej_rescale(psVar59,(secp256k1_fe *)psVar49);
          }
          psVar70 = local_238;
          psStack_570 = (secp256k1_scalar *)0x145e24;
          secp256k1_ecmult_odd_multiples_table
                    (8,state->pre_a + (long)psVar56 * 8,state->aux + (long)psVar56 * 8,
                     (secp256k1_fe *)psVar49,psVar70);
          if (psVar56 != (secp256k1_gej *)0x0) {
            psStack_570 = (secp256k1_scalar *)0x145e48;
            secp256k1_fe_mul(state->aux + (long)psVar56 * 8,state->aux + (long)psVar56 * 8,&a->z);
          }
          psVar56 = (secp256k1_gej *)((long)(psVar56->x).n + 1);
        }
      }
      a = a + 1;
      na = (secp256k1_scalar *)((((secp256k1_gej *)na)->x).n + 4);
      num = (long)((secp256k1_scalar *)(num + -0x20))->d + 0x1f;
    } while ((secp256k1_scalar *)num != (secp256k1_scalar *)0x0);
    if (psVar56 != (secp256k1_gej *)0x0) {
      psStack_570 = (secp256k1_scalar *)0x145e83;
      local_559 = psVar56 == (secp256k1_gej *)0x0;
      secp256k1_ge_table_set_globalz((long)psVar56 * 8,state->pre_a,state->aux);
      lVar77 = 0;
      psVar61 = (secp256k1_gej *)0x0;
      psVar59 = (secp256k1_gej *)0x0;
      local_548 = psVar56;
      do {
        lVar57 = 0;
        local_550 = psVar61;
        do {
          psStack_570 = (secp256k1_scalar *)0x145eb6;
          secp256k1_fe_mul((secp256k1_fe *)((long)state->aux->n + lVar57 + lVar77),
                           (secp256k1_fe *)((long)(state->pre_a->x).n + (long)(psVar61->x).n),
                           &secp256k1_const_beta);
          psVar61 = (secp256k1_gej *)((psVar61->z).n + 1);
          lVar57 = lVar57 + 0x30;
        } while (lVar57 != 0x180);
        psVar59 = (secp256k1_gej *)((long)(psVar59->x).n + 1);
        psVar61 = (secp256k1_gej *)(local_550[5].y.n + 3);
        lVar77 = lVar77 + 0x180;
      } while (psVar59 != local_548);
      goto LAB_00145ef4;
    }
  }
  local_548 = (secp256k1_gej *)0x0;
LAB_00145ef4:
  if (local_540 == (uint64_t *)0x0) {
    local_528 = 0;
    local_530 = 0;
    uVar79 = (uint)local_558;
  }
  else {
    psStack_570 = (secp256k1_scalar *)0x145f1e;
    secp256k1_scalar_split_128(&local_468,&local_488,(secp256k1_scalar *)local_540);
    psStack_570 = (secp256k1_scalar *)0x145f38;
    uVar41 = secp256k1_ecmult_wnaf((int *)local_238,0x81,&local_468,0xf);
    psVar49 = (secp256k1_gej *)0xf;
    psStack_570 = (secp256k1_scalar *)0x145f54;
    uVar42 = secp256k1_ecmult_wnaf((int *)local_448,0x81,&local_488,0xf);
    uVar79 = (uint)local_558;
    if ((int)(uint)local_558 < (int)uVar41) {
      uVar79 = uVar41;
    }
    if ((int)uVar79 < (int)uVar42) {
      uVar79 = uVar42;
    }
    local_530 = (long)(int)uVar42;
    local_528 = (long)(int)uVar41;
  }
  psVar63 = local_538;
  psStack_570 = (secp256k1_scalar *)0x145f98;
  secp256k1_gej_set_infinity(local_538);
  if (0 < (int)uVar79) {
    psVar56 = (secp256k1_gej *)(ulong)uVar79;
    local_540 = (uint64_t *)((long)psVar56 * 4 - 4);
    local_558 = (secp256k1_gej *)state;
    do {
      psStack_570 = (secp256k1_scalar *)0x145fc1;
      secp256k1_gej_double_var(psVar63,psVar63,(secp256k1_fe *)0x0);
      local_550 = psVar56;
      psVar61 = psVar56;
      if (local_559 == '\0') {
        na = (secp256k1_scalar *)0x40c;
        a = (secp256k1_gej *)0x30;
        r_02 = (secp256k1_scalar *)0x0;
        num = (size_t)local_540;
        psVar59 = local_548;
        do {
          psVar49 = (secp256k1_gej *)(((secp256k1_gej *)state)->x).n[2];
          if (((long)psVar61 <= (long)*(int *)(&psVar49[-1].field_0x94 + (long)na)) &&
             (uVar79 = *(uint *)((long)(psVar49->x).n + num), uVar79 != 0)) {
            if ((uVar79 & 1) == 0) {
              psStack_570 = (secp256k1_scalar *)0x146348;
              secp256k1_ecmult_strauss_wnaf_cold_5();
LAB_00146348:
              psStack_570 = (secp256k1_scalar *)0x14634d;
              secp256k1_ecmult_strauss_wnaf_cold_8();
LAB_0014634d:
              psStack_570 = (secp256k1_scalar *)0x146352;
              secp256k1_ecmult_strauss_wnaf_cold_3();
LAB_00146352:
              psStack_570 = (secp256k1_scalar *)0x146357;
              secp256k1_ecmult_strauss_wnaf_cold_6();
            }
            else {
              if ((int)uVar79 < -0xf) goto LAB_0014634d;
              if ((int)uVar79 < 0x10) {
                uVar3 = (((secp256k1_gej *)state)->x).n[1];
                if ((int)uVar79 < 1) {
                  puVar62 = (uint64_t *)((long)&a->x + uVar3 + (ulong)(~uVar79 >> 1) * 0x68 + -0x30)
                  ;
                  psVar78 = &local_520;
                  for (lVar77 = 0xd; lVar77 != 0; lVar77 = lVar77 + -1) {
                    (psVar78->x).n[0] = *puVar62;
                    puVar62 = puVar62 + (ulong)bVar83 * -2 + 1;
                    psVar78 = (secp256k1_ge *)((long)psVar78 + ((ulong)bVar83 * -2 + 1) * 8);
                  }
                  psVar64 = &local_520.y;
                  psStack_570 = (secp256k1_scalar *)0x146080;
                  secp256k1_fe_verify(psVar64);
                  psStack_570 = (secp256k1_scalar *)0x14608d;
                  secp256k1_fe_verify_magnitude(psVar64,1);
                  local_520.y.n[0] = 0x3ffffbfffff0bc - local_520.y.n[0];
                  local_520.y.n[1] = 0x3ffffffffffffc - local_520.y.n[1];
                  local_520.y.n[2] = 0x3ffffffffffffc - local_520.y.n[2];
                  local_520.y.n[3] = 0x3ffffffffffffc - local_520.y.n[3];
                  local_520.y.n[4] = 0x3fffffffffffc - local_520.y.n[4];
                  local_520.y.magnitude = 2;
                  local_520.y.normalized = 0;
                  psStack_570 = (secp256k1_scalar *)0x1460f1;
                  secp256k1_fe_verify(psVar64);
                  state = (secp256k1_strauss_state *)local_558;
                }
                else {
                  puVar62 = (uint64_t *)
                            ((long)&a->x + uVar3 + (ulong)(uVar79 - 1 >> 1) * 0x68 + -0x30);
                  psVar78 = &local_520;
                  for (lVar77 = 0xd; lVar77 != 0; lVar77 = lVar77 + -1) {
                    (psVar78->x).n[0] = *puVar62;
                    puVar62 = puVar62 + (ulong)bVar83 * -2 + 1;
                    psVar78 = (secp256k1_ge *)((long)psVar78 + ((ulong)bVar83 * -2 + 1) * 8);
                  }
                }
                psStack_570 = (secp256k1_scalar *)0x14610d;
                psVar63 = local_538;
                secp256k1_gej_add_ge_var(local_538,local_538,&local_520,(secp256k1_fe *)0x0);
                psVar49 = (secp256k1_gej *)(((secp256k1_gej *)state)->x).n[2];
                psVar61 = local_550;
                goto LAB_00146116;
              }
            }
            psStack_570 = (secp256k1_scalar *)0x14635c;
            secp256k1_ecmult_strauss_wnaf_cold_4();
LAB_0014635c:
            psStack_570 = (secp256k1_scalar *)0x146361;
            secp256k1_ecmult_strauss_wnaf_cold_7();
            goto LAB_00146361;
          }
LAB_00146116:
          if (((long)psVar61 <=
               (long)*(int *)((long)(psVar49->x).n + (long)(((secp256k1_gej *)na)->x).n)) &&
             (uVar79 = *(uint *)((undefined1 *)((long)psVar49[3].y.n + 0xc) + num), uVar79 != 0)) {
            if ((uVar79 & 1) == 0) goto LAB_00146348;
            if ((int)uVar79 < -0xf) goto LAB_00146352;
            if ((int)uVar79 < 0x10) {
              uVar3 = (((secp256k1_gej *)state)->x).n[0];
              uVar4 = (((secp256k1_gej *)state)->x).n[1];
              if ((int)uVar79 < 1) {
                psStack_570 = (secp256k1_scalar *)0x1461ae;
                secp256k1_ge_set_xy(&local_520,
                                    (secp256k1_fe *)
                                    ((long)(&((secp256k1_gej *)r_02)->x)[~uVar79 >> 1].n + uVar3),
                                    (secp256k1_fe *)
                                    ((long)&a->x + (ulong)(~uVar79 >> 1) * 0x68 + uVar4));
                psStack_570 = (secp256k1_scalar *)0x1461b8;
                secp256k1_fe_verify(&local_520.y);
                psStack_570 = (secp256k1_scalar *)0x1461c7;
                secp256k1_fe_verify_magnitude(&local_520.y,1);
                local_520.y.n[0] = 0x3ffffbfffff0bc - local_520.y.n[0];
                local_520.y.n[1] = 0x3ffffffffffffc - local_520.y.n[1];
                local_520.y.n[2] = 0x3ffffffffffffc - local_520.y.n[2];
                local_520.y.n[3] = 0x3ffffffffffffc - local_520.y.n[3];
                local_520.y.n[4] = 0x3fffffffffffc - local_520.y.n[4];
                local_520.y.magnitude = 2;
                local_520.y.normalized = 0;
                psStack_570 = (secp256k1_scalar *)0x14622d;
                secp256k1_fe_verify(&local_520.y);
              }
              else {
                uVar46 = (ulong)(uVar79 - 1 >> 1);
                psStack_570 = (secp256k1_scalar *)0x146180;
                secp256k1_ge_set_xy(&local_520,
                                    (secp256k1_fe *)
                                    ((long)(&((secp256k1_gej *)r_02)->x)[uVar46].n + uVar3),
                                    (secp256k1_fe *)((long)&a->x + uVar46 * 0x68 + uVar4));
              }
              psVar49 = (secp256k1_gej *)0x0;
              psStack_570 = (secp256k1_scalar *)0x14623f;
              psVar63 = local_538;
              secp256k1_gej_add_ge_var(local_538,local_538,&local_520,(secp256k1_fe *)0x0);
              psVar61 = local_550;
              state = (secp256k1_strauss_state *)local_558;
              goto LAB_00146249;
            }
            goto LAB_0014635c;
          }
LAB_00146249:
          num = num + 0x410;
          na = (secp256k1_scalar *)((((secp256k1_gej *)((long)na + 0x390))->z).n + 4);
          a = (secp256k1_gej *)(a[5].y.n + 3);
          r_02 = (secp256k1_scalar *)((((secp256k1_gej *)((long)r_02 + 0x130))->y).n + 4);
          psVar59 = (secp256k1_gej *)&psVar59[-1].field_0x97;
        } while (psVar59 != (secp256k1_gej *)0x0);
      }
      psVar63 = local_538;
      psVar56 = (secp256k1_gej *)&psVar61[-1].field_0x97;
      if (((long)psVar61 <= local_528) &&
         (iVar40 = *(int *)((long)local_238[0].x.n + (long)psVar56 * 4), iVar40 != 0)) {
        psStack_570 = (secp256k1_scalar *)0x14629a;
        secp256k1_ecmult_table_get_ge_storage(&local_520,secp256k1_pre_g,iVar40,(int)psVar49);
        state = (secp256k1_strauss_state *)local_558;
        psVar49 = (secp256k1_gej *)local_4b8;
        psStack_570 = (secp256k1_scalar *)0x1462b5;
        secp256k1_gej_add_zinv_var(psVar63,psVar63,&local_520,(secp256k1_fe *)psVar49);
        psVar61 = local_550;
      }
      if (((long)psVar61 <= local_530) &&
         (iVar40 = *(int *)((long)local_448[0].d + (long)psVar56 * 4), iVar40 != 0)) {
        psStack_570 = (secp256k1_scalar *)0x1462e0;
        secp256k1_ecmult_table_get_ge_storage(&local_520,secp256k1_pre_g_128,iVar40,(int)psVar49);
        state = (secp256k1_strauss_state *)local_558;
        psVar49 = (secp256k1_gej *)local_4b8;
        psStack_570 = (secp256k1_scalar *)0x1462fb;
        secp256k1_gej_add_zinv_var(psVar63,psVar63,&local_520,(secp256k1_fe *)psVar49);
        psVar61 = local_550;
      }
      local_540 = (uint64_t *)((long)local_540 - 4);
    } while (1 < (long)psVar61);
  }
  if (psVar63->infinity == 0) {
    psStack_570 = (secp256k1_scalar *)0x146331;
    secp256k1_fe_mul(&psVar63->z,&psVar63->z,(secp256k1_fe *)local_4b8);
  }
  return;
LAB_00146361:
  psStack_570 = (secp256k1_scalar *)0x146366;
  secp256k1_ecmult_strauss_wnaf_cold_2();
LAB_00146366:
  psStack_570 = (secp256k1_scalar *)secp256k1_scalar_split_lambda;
  secp256k1_ecmult_strauss_wnaf_cold_1();
  pcStack_678 = (code *)0x14638d;
  psVar56 = psVar61;
  r_03 = r_00;
  psStack_598 = (secp256k1_gej *)r_02;
  psStack_590 = (secp256k1_gej *)na;
  psStack_588 = a;
  psStack_580 = (secp256k1_gej *)state;
  psStack_578 = psVar59;
  psStack_570 = (secp256k1_scalar *)num;
  secp256k1_scalar_verify((secp256k1_scalar *)r_00);
  if (psVar63 == r_00) {
    pcStack_678 = (code *)0x1468a8;
    secp256k1_scalar_split_lambda_cold_6();
LAB_001468a8:
    pcStack_678 = (code *)0x1468ad;
    secp256k1_scalar_split_lambda_cold_5();
LAB_001468ad:
    pcStack_678 = (code *)0x1468b2;
    secp256k1_scalar_split_lambda_cold_4();
  }
  else {
    if (psVar61 == r_00) goto LAB_001468a8;
    if (psVar63 == psVar61) goto LAB_001468ad;
    pcStack_678 = (code *)0x1463b0;
    secp256k1_scalar_verify((secp256k1_scalar *)r_00);
    pcStack_678 = (code *)0x1463bf;
    secp256k1_scalar_verify(&secp256k1_scalar_split_lambda::g1);
    uVar46 = (r_00->x).n[0];
    uVar47 = (r_00->x).n[1];
    uVar48 = (r_00->x).n[2];
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar46;
    uVar51 = SUB168(auVar5 * ZEXT816(0xe893209a45dbb031),8);
    auVar38._8_8_ = 0;
    auVar38._0_8_ = uVar51;
    auStack_660._0_8_ = SUB168(auVar5 * ZEXT816(0xe893209a45dbb031),0);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar46;
    auVar6 = auVar6 * ZEXT816(0x3daa8a1471e8ca7f);
    uVar65 = SUB168(auVar6 + auVar38,0);
    uVar71 = SUB168(auVar6 + auVar38,8);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar47;
    uVar52 = SUB168(auVar7 * ZEXT816(0xe893209a45dbb031),8);
    uVar45 = SUB168(auVar7 * ZEXT816(0xe893209a45dbb031),0);
    auStack_660._8_8_ = uVar65 + uVar45;
    uVar45 = (ulong)CARRY8(uVar65,uVar45);
    uVar65 = uVar71 + uVar52;
    uVar72 = uVar65 + uVar45;
    uVar73 = (ulong)CARRY8(auVar6._8_8_,(ulong)CARRY8(uVar51,auVar6._0_8_)) +
             (ulong)(CARRY8(uVar71,uVar52) || CARRY8(uVar65,uVar45));
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar46;
    uVar53 = SUB168(auVar8 * ZEXT816(0xe86c90e49284eb15),8);
    uVar45 = SUB168(auVar8 * ZEXT816(0xe86c90e49284eb15),0);
    uVar51 = uVar72 + uVar45;
    uVar45 = (ulong)CARRY8(uVar72,uVar45);
    uVar52 = uVar73 + uVar53;
    uVar74 = uVar52 + uVar45;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar47;
    uVar54 = SUB168(auVar9 * ZEXT816(0x3daa8a1471e8ca7f),8);
    uVar65 = SUB168(auVar9 * ZEXT816(0x3daa8a1471e8ca7f),0);
    uVar72 = uVar51 + uVar65;
    uVar65 = (ulong)CARRY8(uVar51,uVar65);
    uVar71 = uVar74 + uVar54;
    uVar75 = uVar71 + uVar65;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar48;
    uVar55 = SUB168(auVar10 * ZEXT816(0xe893209a45dbb031),8);
    uVar51 = SUB168(auVar10 * ZEXT816(0xe893209a45dbb031),0);
    auStack_660._16_8_ = uVar72 + uVar51;
    uVar51 = (ulong)CARRY8(uVar72,uVar51);
    uVar72 = uVar75 + uVar55;
    uVar76 = uVar72 + uVar51;
    uVar66 = (ulong)(CARRY8(uVar73,uVar53) || CARRY8(uVar52,uVar45)) +
             (ulong)(CARRY8(uVar74,uVar54) || CARRY8(uVar71,uVar65)) +
             (ulong)(CARRY8(uVar75,uVar55) || CARRY8(uVar72,uVar51));
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar46;
    uVar55 = SUB168(auVar11 * ZEXT816(0x3086d221a7d46bcd),8);
    uVar46 = SUB168(auVar11 * ZEXT816(0x3086d221a7d46bcd),0);
    uVar51 = uVar76 + uVar46;
    uVar45 = (ulong)CARRY8(uVar76,uVar46);
    uVar71 = uVar66 + uVar55;
    uVar76 = uVar71 + uVar45;
    uVar46 = (r_00->x).n[3];
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar47;
    uVar73 = SUB168(auVar12 * ZEXT816(0xe86c90e49284eb15),8);
    uVar65 = SUB168(auVar12 * ZEXT816(0xe86c90e49284eb15),0);
    uVar52 = uVar51 + uVar65;
    uVar65 = (ulong)CARRY8(uVar51,uVar65);
    uVar72 = uVar76 + uVar73;
    uVar67 = uVar72 + uVar65;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar48;
    uVar74 = SUB168(auVar13 * ZEXT816(0x3daa8a1471e8ca7f),8);
    uVar51 = SUB168(auVar13 * ZEXT816(0x3daa8a1471e8ca7f),0);
    uVar54 = uVar52 + uVar51;
    uVar51 = (ulong)CARRY8(uVar52,uVar51);
    uVar53 = uVar67 + uVar74;
    uVar68 = uVar53 + uVar51;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar46;
    uVar75 = SUB168(auVar14 * ZEXT816(0xe893209a45dbb031),8);
    uVar52 = SUB168(auVar14 * ZEXT816(0xe893209a45dbb031),0);
    auStack_660._24_8_ = uVar54 + uVar52;
    uVar52 = (ulong)CARRY8(uVar54,uVar52);
    uVar54 = uVar68 + uVar75;
    uVar69 = uVar54 + uVar52;
    uVar55 = (ulong)(CARRY8(uVar66,uVar55) || CARRY8(uVar71,uVar45)) +
             (ulong)(CARRY8(uVar76,uVar73) || CARRY8(uVar72,uVar65)) +
             (ulong)(CARRY8(uVar67,uVar74) || CARRY8(uVar53,uVar51)) +
             (ulong)(CARRY8(uVar68,uVar75) || CARRY8(uVar54,uVar52));
    auVar15._8_8_ = 0;
    auVar15._0_8_ = uVar47;
    uVar72 = SUB168(auVar15 * ZEXT816(0x3086d221a7d46bcd),8);
    uVar47 = SUB168(auVar15 * ZEXT816(0x3086d221a7d46bcd),0);
    uVar65 = uVar69 + uVar47;
    uVar47 = (ulong)CARRY8(uVar69,uVar47);
    uVar51 = uVar55 + uVar72;
    uVar73 = uVar51 + uVar47;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = uVar48;
    uVar53 = SUB168(auVar16 * ZEXT816(0xe86c90e49284eb15),8);
    uVar45 = SUB168(auVar16 * ZEXT816(0xe86c90e49284eb15),0);
    uVar71 = uVar65 + uVar45;
    uVar45 = (ulong)CARRY8(uVar65,uVar45);
    uVar52 = uVar73 + uVar53;
    uVar74 = uVar52 + uVar45;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar46;
    uVar54 = SUB168(auVar17 * ZEXT816(0x3daa8a1471e8ca7f),8);
    uVar65 = SUB168(auVar17 * ZEXT816(0x3daa8a1471e8ca7f),0);
    auStack_660._32_8_ = uVar71 + uVar65;
    uVar65 = (ulong)CARRY8(uVar71,uVar65);
    uVar71 = uVar74 + uVar54;
    uVar75 = uVar71 + uVar65;
    uVar71 = (ulong)(CARRY8(uVar55,uVar72) || CARRY8(uVar51,uVar47)) +
             (ulong)(CARRY8(uVar73,uVar53) || CARRY8(uVar52,uVar45)) +
             (ulong)(CARRY8(uVar74,uVar54) || CARRY8(uVar71,uVar65));
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar48;
    uVar51 = SUB168(auVar18 * ZEXT816(0x3086d221a7d46bcd),8);
    uVar47 = SUB168(auVar18 * ZEXT816(0x3086d221a7d46bcd),0);
    uVar65 = uVar75 + uVar47;
    uVar47 = (ulong)CARRY8(uVar75,uVar47);
    uVar45 = uVar71 + uVar51;
    uVar72 = uVar45 + uVar47;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar46;
    uVar52 = SUB168(auVar19 * ZEXT816(0xe86c90e49284eb15),8);
    uVar48 = SUB168(auVar19 * ZEXT816(0xe86c90e49284eb15),0);
    auStack_660._40_8_ = uVar65 + uVar48;
    uVar48 = (ulong)CARRY8(uVar65,uVar48);
    uVar65 = uVar72 + uVar52;
    auStack_660._56_8_ =
         (ulong)(CARRY8(uVar71,uVar51) || CARRY8(uVar45,uVar47)) +
         (ulong)(CARRY8(uVar72,uVar52) || CARRY8(uVar65,uVar48));
    auStack_660._48_8_ = uVar65 + uVar48;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = uVar46;
    auStack_660._48_16_ = auVar20 * ZEXT816(0x3086d221a7d46bcd) + auStack_660._48_16_;
    uStack_5d0 = 0;
    uStack_5c8 = 0;
    pcStack_678 = (code *)0x14653f;
    psStack_670 = psVar63;
    psStack_668 = psVar61;
    auStack_5e0 = auStack_660._48_16_;
    secp256k1_scalar_cadd_bit
              ((secp256k1_scalar *)auStack_5e0,0,(uint)((ulong)auStack_660._40_8_ >> 0x3f));
    pcStack_678 = (code *)0x146547;
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_5e0);
    pcStack_678 = (code *)0x14654f;
    secp256k1_scalar_verify((secp256k1_scalar *)r_00);
    pcStack_678 = (code *)0x14655e;
    secp256k1_scalar_verify(&secp256k1_scalar_split_lambda::g2);
    psVar63 = psStack_668;
    na = (secp256k1_scalar *)psStack_670;
    uVar46 = (r_00->x).n[0];
    uVar47 = (r_00->x).n[1];
    psVar49 = (secp256k1_gej *)(r_00->x).n[2];
    a = (secp256k1_gej *)0x6f547fa90abfe4c4;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = uVar46;
    uVar65 = SUB168(auVar21 * ZEXT816(0x1571b4ae8ac47f71),8);
    auVar39._8_8_ = 0;
    auVar39._0_8_ = uVar65;
    auStack_660._0_8_ = SUB168(auVar21 * ZEXT816(0x1571b4ae8ac47f71),0);
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar46;
    auVar22 = auVar22 * ZEXT816(0x221208ac9df506c6);
    uVar45 = SUB168(auVar22 + auVar39,0);
    uVar52 = SUB168(auVar22 + auVar39,8);
    auVar23._8_8_ = 0;
    auVar23._0_8_ = uVar47;
    uVar51 = SUB168(auVar23 * ZEXT816(0x1571b4ae8ac47f71),8);
    uVar48 = SUB168(auVar23 * ZEXT816(0x1571b4ae8ac47f71),0);
    auStack_660._8_8_ = uVar45 + uVar48;
    uVar48 = (ulong)CARRY8(uVar45,uVar48);
    uVar45 = uVar52 + uVar51;
    uVar71 = uVar45 + uVar48;
    uVar55 = (ulong)CARRY8(auVar22._8_8_,(ulong)CARRY8(uVar65,auVar22._0_8_)) +
             (ulong)(CARRY8(uVar52,uVar51) || CARRY8(uVar45,uVar48));
    auVar24._8_8_ = 0;
    auVar24._0_8_ = uVar46;
    uVar72 = SUB168(auVar24 * ZEXT816(0x6f547fa90abfe4c4),8);
    uVar48 = SUB168(auVar24 * ZEXT816(0x6f547fa90abfe4c4),0);
    uVar65 = uVar71 + uVar48;
    uVar48 = (ulong)CARRY8(uVar71,uVar48);
    uVar51 = uVar55 + uVar72;
    uVar73 = uVar51 + uVar48;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar47;
    uVar53 = SUB168(auVar25 * ZEXT816(0x221208ac9df506c6),8);
    uVar45 = SUB168(auVar25 * ZEXT816(0x221208ac9df506c6),0);
    uVar71 = uVar65 + uVar45;
    uVar45 = (ulong)CARRY8(uVar65,uVar45);
    uVar52 = uVar73 + uVar53;
    uVar74 = uVar52 + uVar45;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = psVar49;
    uVar54 = SUB168(auVar26 * ZEXT816(0x1571b4ae8ac47f71),8);
    uVar65 = SUB168(auVar26 * ZEXT816(0x1571b4ae8ac47f71),0);
    auStack_660._16_8_ = uVar71 + uVar65;
    uVar65 = (ulong)CARRY8(uVar71,uVar65);
    uVar71 = uVar74 + uVar54;
    uVar66 = uVar71 + uVar65;
    uVar75 = (ulong)(CARRY8(uVar55,uVar72) || CARRY8(uVar51,uVar48)) +
             (ulong)(CARRY8(uVar73,uVar53) || CARRY8(uVar52,uVar45)) +
             (ulong)(CARRY8(uVar74,uVar54) || CARRY8(uVar71,uVar65));
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar46;
    uVar54 = SUB168(auVar27 * ZEXT816(0xe4437ed6010e8828),8);
    uVar46 = SUB168(auVar27 * ZEXT816(0xe4437ed6010e8828),0);
    uVar65 = uVar66 + uVar46;
    uVar48 = (ulong)CARRY8(uVar66,uVar46);
    uVar52 = uVar75 + uVar54;
    uVar66 = uVar52 + uVar48;
    uVar46 = (r_00->x).n[3];
    auVar28._8_8_ = 0;
    auVar28._0_8_ = uVar47;
    uVar55 = SUB168(auVar28 * ZEXT816(0x6f547fa90abfe4c4),8);
    uVar45 = SUB168(auVar28 * ZEXT816(0x6f547fa90abfe4c4),0);
    uVar51 = uVar65 + uVar45;
    uVar45 = (ulong)CARRY8(uVar65,uVar45);
    uVar71 = uVar66 + uVar55;
    uVar76 = uVar71 + uVar45;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = psVar49;
    uVar73 = SUB168(auVar29 * ZEXT816(0x221208ac9df506c6),8);
    uVar65 = SUB168(auVar29 * ZEXT816(0x221208ac9df506c6),0);
    uVar53 = uVar51 + uVar65;
    uVar65 = (ulong)CARRY8(uVar51,uVar65);
    uVar72 = uVar76 + uVar73;
    uVar67 = uVar72 + uVar65;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = uVar46;
    uVar74 = SUB168(auVar30 * ZEXT816(0x1571b4ae8ac47f71),8);
    uVar51 = SUB168(auVar30 * ZEXT816(0x1571b4ae8ac47f71),0);
    auStack_660._24_8_ = uVar53 + uVar51;
    uVar51 = (ulong)CARRY8(uVar53,uVar51);
    uVar53 = uVar67 + uVar74;
    uVar68 = uVar53 + uVar51;
    uVar54 = (ulong)(CARRY8(uVar75,uVar54) || CARRY8(uVar52,uVar48)) +
             (ulong)(CARRY8(uVar66,uVar55) || CARRY8(uVar71,uVar45)) +
             (ulong)(CARRY8(uVar76,uVar73) || CARRY8(uVar72,uVar65)) +
             (ulong)(CARRY8(uVar67,uVar74) || CARRY8(uVar53,uVar51));
    auVar31._8_8_ = 0;
    auVar31._0_8_ = uVar47;
    uVar71 = SUB168(auVar31 * ZEXT816(0xe4437ed6010e8828),8);
    uVar47 = SUB168(auVar31 * ZEXT816(0xe4437ed6010e8828),0);
    uVar45 = uVar68 + uVar47;
    uVar47 = (ulong)CARRY8(uVar68,uVar47);
    uVar65 = uVar54 + uVar71;
    uVar55 = uVar65 + uVar47;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = psVar49;
    uVar72 = SUB168(auVar32 * ZEXT816(0x6f547fa90abfe4c4),8);
    uVar48 = SUB168(auVar32 * ZEXT816(0x6f547fa90abfe4c4),0);
    uVar52 = uVar45 + uVar48;
    uVar48 = (ulong)CARRY8(uVar45,uVar48);
    uVar51 = uVar55 + uVar72;
    uVar73 = uVar51 + uVar48;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = uVar46;
    uVar53 = SUB168(auVar33 * ZEXT816(0x221208ac9df506c6),8);
    uVar45 = SUB168(auVar33 * ZEXT816(0x221208ac9df506c6),0);
    auStack_660._32_8_ = uVar52 + uVar45;
    uVar45 = (ulong)CARRY8(uVar52,uVar45);
    uVar52 = uVar73 + uVar53;
    uVar74 = uVar52 + uVar45;
    uVar71 = (ulong)(CARRY8(uVar54,uVar71) || CARRY8(uVar65,uVar47)) +
             (ulong)(CARRY8(uVar55,uVar72) || CARRY8(uVar51,uVar48)) +
             (ulong)(CARRY8(uVar73,uVar53) || CARRY8(uVar52,uVar45));
    auVar34._8_8_ = 0;
    auVar34._0_8_ = psVar49;
    uVar51 = SUB168(auVar34 * ZEXT816(0xe4437ed6010e8828),8);
    uVar47 = SUB168(auVar34 * ZEXT816(0xe4437ed6010e8828),0);
    uVar65 = uVar74 + uVar47;
    uVar47 = (ulong)CARRY8(uVar74,uVar47);
    uVar45 = uVar71 + uVar51;
    uVar72 = uVar45 + uVar47;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = uVar46;
    uVar52 = SUB168(auVar35 * ZEXT816(0x6f547fa90abfe4c4),8);
    uVar48 = SUB168(auVar35 * ZEXT816(0x6f547fa90abfe4c4),0);
    auStack_660._40_8_ = uVar65 + uVar48;
    uVar48 = (ulong)CARRY8(uVar65,uVar48);
    uVar65 = uVar72 + uVar52;
    auVar37._8_8_ =
         (ulong)(CARRY8(uVar71,uVar51) || CARRY8(uVar45,uVar47)) +
         (ulong)(CARRY8(uVar72,uVar52) || CARRY8(uVar65,uVar48));
    auVar37._0_8_ = uVar65 + uVar48;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = uVar46;
    auStack_660._48_16_ = auVar36 * ZEXT816(0xe4437ed6010e8828) + auVar37;
    psVar70 = auStack_660._56_8_;
    uStack_5b0 = 0;
    uStack_5a8 = 0;
    pcStack_678 = (code *)0x1466de;
    auStack_5c0 = auStack_660._48_16_;
    secp256k1_scalar_cadd_bit
              ((secp256k1_scalar *)auStack_5c0,0,(uint)((ulong)auStack_660._40_8_ >> 0x3f));
    pcStack_678 = (code *)0x1466e6;
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_5c0);
    pcStack_678 = (code *)0x146700;
    secp256k1_scalar_mul
              ((secp256k1_scalar *)auStack_5e0,(secp256k1_scalar *)auStack_5e0,
               &secp256k1_scalar_split_lambda::minus_b1);
    pcStack_678 = (code *)0x146712;
    secp256k1_scalar_mul
              ((secp256k1_scalar *)auStack_5c0,(secp256k1_scalar *)auStack_5c0,
               &secp256k1_scalar_split_lambda::minus_b2);
    pcStack_678 = (code *)0x146720;
    secp256k1_scalar_add
              ((secp256k1_scalar *)psVar63,(secp256k1_scalar *)auStack_5e0,
               (secp256k1_scalar *)auStack_5c0);
    r_02 = &secp256k1_const_lambda;
    pcStack_678 = (code *)0x146735;
    secp256k1_scalar_mul(na,(secp256k1_scalar *)psVar63,&secp256k1_const_lambda);
    pcStack_678 = (code *)0x146740;
    secp256k1_scalar_negate(na,na);
    pcStack_678 = (code *)0x14674e;
    secp256k1_scalar_add(na,na,(secp256k1_scalar *)r_00);
    pcStack_678 = (code *)0x146756;
    secp256k1_scalar_verify(na);
    pcStack_678 = (code *)0x14675e;
    secp256k1_scalar_verify((secp256k1_scalar *)psVar63);
    psVar61 = (secp256k1_gej *)auStack_660;
    pcStack_678 = (code *)0x146771;
    secp256k1_scalar_mul
              ((secp256k1_scalar *)psVar61,&secp256k1_const_lambda,(secp256k1_scalar *)psVar63);
    pcStack_678 = (code *)0x14677f;
    psVar56 = psVar61;
    secp256k1_scalar_add((secp256k1_scalar *)psVar61,(secp256k1_scalar *)psVar61,na);
    pcStack_678 = (code *)0x146787;
    secp256k1_scalar_verify((secp256k1_scalar *)psVar61);
    pcStack_678 = (code *)0x14678f;
    r_03 = r_00;
    secp256k1_scalar_verify((secp256k1_scalar *)r_00);
    if ((((auStack_660._0_8_ == (r_00->x).n[0]) && (auStack_660._8_8_ == (r_00->x).n[1])) &&
        (auStack_660._16_8_ == (r_00->x).n[2])) && (auStack_660._24_8_ == (r_00->x).n[3])) {
      pcStack_678 = (code *)0x1467d9;
      secp256k1_scalar_negate((secp256k1_scalar *)auStack_660,na);
      pcStack_678 = (code *)0x1467e6;
      secp256k1_scalar_get_b32(abStack_600,na);
      pcStack_678 = (code *)0x1467f3;
      secp256k1_scalar_get_b32(abStack_620,(secp256k1_scalar *)auStack_660);
      lVar77 = 0;
      do {
        if (abStack_600[lVar77] != (&secp256k1_scalar_split_lambda_verify_k1_bound)[lVar77]) {
          if (abStack_600[lVar77] < (byte)(&secp256k1_scalar_split_lambda_verify_k1_bound)[lVar77])
          goto LAB_0014682d;
          break;
        }
        lVar77 = lVar77 + 1;
      } while (lVar77 != 0x20);
      uVar46 = 0;
      do {
        uVar81 = abStack_620[uVar46] <
                 (byte)(&secp256k1_scalar_split_lambda_verify_k1_bound)[uVar46];
        if (abStack_620[uVar46] != (&secp256k1_scalar_split_lambda_verify_k1_bound)[uVar46])
        goto LAB_0014682b;
        uVar46 = uVar46 + 1;
        uVar81 = uVar46 < 0x20;
      } while (uVar46 != 0x20);
      do {
        pcStack_678 = (code *)0x14682b;
        secp256k1_scalar_split_lambda_cold_2();
LAB_0014682b:
      } while (!(bool)uVar81);
LAB_0014682d:
      pcStack_678 = (code *)0x14683d;
      secp256k1_scalar_negate((secp256k1_scalar *)auStack_660,(secp256k1_scalar *)psVar63);
      pcStack_678 = (code *)0x14684a;
      secp256k1_scalar_get_b32(abStack_600,(secp256k1_scalar *)psVar63);
      pcStack_678 = (code *)0x146857;
      secp256k1_scalar_get_b32(abStack_620,(secp256k1_scalar *)auStack_660);
      lVar77 = 0;
      do {
        if (abStack_600[lVar77] != (&secp256k1_scalar_split_lambda_verify_k2_bound)[lVar77]) {
          if (abStack_600[lVar77] < (byte)(&secp256k1_scalar_split_lambda_verify_k2_bound)[lVar77])
          {
            return;
          }
          break;
        }
        lVar77 = lVar77 + 1;
      } while (lVar77 != 0x20);
      uVar46 = 0;
      do {
        uVar81 = abStack_620[uVar46] <
                 (byte)(&secp256k1_scalar_split_lambda_verify_k2_bound)[uVar46];
        if (abStack_620[uVar46] != (&secp256k1_scalar_split_lambda_verify_k2_bound)[uVar46])
        goto LAB_0014688f;
        uVar46 = uVar46 + 1;
        uVar81 = uVar46 < 0x20;
      } while (uVar46 != 0x20);
      do {
        pcStack_678 = (code *)0x14688f;
        secp256k1_scalar_split_lambda_cold_1();
LAB_0014688f:
      } while (!(bool)uVar81);
      return;
    }
  }
  pcStack_678 = secp256k1_ecmult_wnaf;
  secp256k1_scalar_split_lambda_cold_3();
  psVar59 = r_00;
  psStack_6a0 = (secp256k1_gej *)r_02;
  psStack_698 = (secp256k1_gej *)na;
  psStack_690 = a;
  psStack_688 = psVar61;
  psStack_680 = psVar63;
  if (r_03 == (secp256k1_gej *)0x0) {
LAB_00146a49:
    psStack_6f0 = (secp256k1_gej *)0x146a4e;
    secp256k1_ecmult_wnaf_cold_5();
    psVar50 = psVar49;
    psVar58 = (secp256k1_gej *)r_02;
LAB_00146a4e:
    psStack_6f0 = (secp256k1_gej *)0x146a53;
    secp256k1_ecmult_wnaf_cold_4();
  }
  else {
    psVar50 = psVar49;
    psVar58 = (secp256k1_gej *)r_02;
    psVar61 = extraout_RDX;
    if (extraout_RDX == (secp256k1_gej *)0x0) goto LAB_00146a4e;
    uVar79 = (uint)psVar49;
    psVar58 = (secp256k1_gej *)((ulong)psVar49 & 0xffffffff);
    psVar61 = extraout_RDX;
    if (1 < (int)uVar79) {
      iVar40 = (int)psVar56;
      psVar59 = (secp256k1_gej *)((ulong)psVar56 & 0xffffffff);
      psStack_6d0 = r_03;
      if (0 < iVar40) {
        psVar56 = (secp256k1_gej *)0x0;
        psStack_6f0 = (secp256k1_gej *)0x146902;
        memset(r_03,0,(long)psVar59 << 2);
      }
      auStack_6c8._0_8_ = (extraout_RDX->x).n[0];
      auStack_6c8._8_8_ = (extraout_RDX->x).n[1];
      unique0x00006c80 = *(undefined1 (*) [16])((extraout_RDX->x).n + 2);
      psVar61 = (secp256k1_gej *)auStack_6c8;
      psStack_6f0 = (secp256k1_gej *)0x146921;
      secp256k1_scalar_verify((secp256k1_scalar *)psVar61);
      iStack_6d8 = 1;
      if ((long)uStack_6b0 < 0) {
        psVar56 = (secp256k1_gej *)auStack_6c8;
        psStack_6f0 = (secp256k1_gej *)0x14693d;
        secp256k1_scalar_negate((secp256k1_scalar *)psVar56,(secp256k1_scalar *)psVar56);
        iStack_6d8 = -1;
      }
      if (iVar40 < 1) {
        psVar63 = (secp256k1_gej *)0x0;
        psVar59 = (secp256k1_gej *)0x0;
      }
      else {
        uStack_6d4 = uVar79 - 1;
        na = (secp256k1_scalar *)0x0;
        uStack_6dc = 0xffffffff;
        psVar63 = psVar56;
        psVar61 = (secp256k1_gej *)0x0;
        do {
          psVar56 = psVar61;
          r_03 = (secp256k1_gej *)auStack_6c8;
          psStack_6f0 = (secp256k1_gej *)0x14696f;
          psVar61 = r_03;
          secp256k1_scalar_verify((secp256k1_scalar *)r_03);
          uVar41 = (uint)psVar56;
          bVar82 = (*(ulong *)(auStack_6c8 + ((ulong)psVar56 >> 6) * 8) >> ((ulong)psVar56 & 0x3f) &
                   1) != 0;
          psVar50 = (secp256k1_gej *)(ulong)bVar82;
          if ((uint)bVar82 == (uint)na) {
            uVar42 = uVar41 + 1;
            psVar56 = psVar63;
            r_03 = psVar61;
          }
          else {
            uVar42 = iVar40 - uVar41;
            if ((int)uVar79 <= (int)(iVar40 - uVar41)) {
              uVar42 = uVar79;
            }
            psStack_6f0 = (secp256k1_gej *)0x1469ab;
            uVar43 = secp256k1_scalar_get_bits_var((secp256k1_scalar *)r_03,uVar41,uVar42);
            uVar44 = uVar43 + (uint)na;
            bVar82 = (uVar44 >> (uStack_6d4 & 0x1f) & 1) != 0;
            na = (secp256k1_scalar *)(ulong)bVar82;
            psVar50 = (secp256k1_gej *)(long)(int)uVar41;
            *(uint *)((long)(psStack_6d0->x).n + (long)psVar50 * 4) =
                 (uVar44 - ((uint)bVar82 << ((byte)psVar49 & 0x1f))) * iStack_6d8;
            uVar42 = uVar42 + uVar41;
            uStack_6dc = uVar41;
          }
          psVar61 = (secp256k1_gej *)(ulong)uVar42;
          a = (secp256k1_gej *)auStack_6c8;
          psVar63 = psVar56;
        } while ((int)uVar42 < iVar40);
        psVar63 = psVar61;
        if ((int)na != 0) goto LAB_00146a58;
        psVar59 = (secp256k1_gej *)(ulong)(uStack_6dc + 1);
        if (0xff < (int)uVar42) {
          return;
        }
      }
      r_02 = (secp256k1_scalar *)auStack_6c8;
      psVar49 = psVar50;
      while( true ) {
        psStack_6f0 = (secp256k1_gej *)0x146a16;
        r_03 = (secp256k1_gej *)r_02;
        secp256k1_scalar_verify(r_02);
        if ((*(ulong *)(auStack_6c8 + ((ulong)psVar63 >> 6) * 8) >> ((ulong)psVar63 & 0x3f) & 1) !=
            0) break;
        uVar79 = (int)psVar63 + 1;
        psVar63 = (secp256k1_gej *)(ulong)uVar79;
        if (uVar79 == 0x100) {
          return;
        }
      }
      psStack_6f0 = (secp256k1_gej *)0x146a49;
      secp256k1_ecmult_wnaf_cold_2();
      goto LAB_00146a49;
    }
  }
  psStack_6f0 = (secp256k1_gej *)0x146a58;
  secp256k1_ecmult_wnaf_cold_3();
LAB_00146a58:
  psStack_6f0 = (secp256k1_gej *)secp256k1_ecmult_odd_multiples_table;
  secp256k1_ecmult_wnaf_cold_1();
  psStack_718 = psVar58;
  psStack_710 = (secp256k1_gej *)na;
  psStack_708 = a;
  psStack_700 = psVar61;
  psStack_6f8 = psVar63;
  psStack_6f0 = psVar59;
  if (psVar70->infinity == 0) {
    psStack_8c8 = (secp256k1_gej *)0x146aa1;
    psStack_8b8 = psVar50;
    secp256k1_gej_double_var(&sStack_818,psVar70,(secp256k1_fe *)0x0);
    psStack_8c8 = (secp256k1_gej *)0x146ab9;
    secp256k1_ge_set_xy(&sStack_780,&sStack_818.x,&sStack_818.y);
    psStack_8c8 = (secp256k1_gej *)0x146acf;
    secp256k1_ge_set_gej_zinv((secp256k1_ge *)psVar56,psVar70,&sStack_818.z);
    psStack_8c8 = (secp256k1_gej *)0x146adc;
    secp256k1_gej_set_ge(&sStack_8b0,(secp256k1_ge *)psVar56);
    sStack_8b0.z.n[0] = (psVar70->z).n[0];
    sStack_8b0.z.n[1] = (psVar70->z).n[1];
    sStack_8b0.z.n[2] = (psVar70->z).n[2];
    sStack_8b0.z.n[3] = (psVar70->z).n[3];
    sStack_8b0.z.n[4] = (psVar70->z).n[4];
    sStack_8b0.z.magnitude = (psVar70->z).magnitude;
    sStack_8b0.z.normalized = (psVar70->z).normalized;
    extraout_RDX_00->n[4] = sStack_818.z.n[4];
    extraout_RDX_00->magnitude = sStack_818.z.magnitude;
    extraout_RDX_00->normalized = sStack_818.z.normalized;
    extraout_RDX_00->n[2] = sStack_818.z.n[2];
    extraout_RDX_00->n[3] = sStack_818.z.n[3];
    extraout_RDX_00->n[0] = sStack_818.z.n[0];
    extraout_RDX_00->n[1] = sStack_818.z.n[1];
    if (1 < (int)r_03) {
      lVar77 = ((ulong)r_03 & 0xffffffff) - 1;
      psVar64 = extraout_RDX_00;
      do {
        psVar56 = (secp256k1_gej *)((psVar56->z).n + 1);
        psVar64 = psVar64 + 1;
        psStack_8c8 = (secp256k1_gej *)0x146b50;
        secp256k1_gej_add_ge_var(&sStack_8b0,&sStack_8b0,&sStack_780,psVar64);
        psStack_8c8 = (secp256k1_gej *)0x146b5e;
        secp256k1_ge_set_xy((secp256k1_ge *)psVar56,&sStack_8b0.x,&sStack_8b0.y);
        lVar77 = lVar77 + -1;
      } while (lVar77 != 0);
    }
    psStack_8c8 = (secp256k1_gej *)0x146b82;
    secp256k1_fe_mul(&psStack_8b8->x,&sStack_8b0.z,&sStack_818.z);
    return;
  }
  psStack_8c8 = (secp256k1_gej *)secp256k1_ge_table_set_globalz;
  secp256k1_ecmult_odd_multiples_table_cold_1();
  psVar49 = r_03;
  psVar70 = psVar56;
  psVar64 = extraout_RDX_01;
  psStack_8f0 = psVar58;
  psStack_8e8 = (secp256k1_gej *)na;
  psStack_8e0 = a;
  psStack_8d8 = psVar61;
  psStack_8d0 = psVar63;
  psStack_8c8 = psVar59;
  if (r_03 != (secp256k1_gej *)0x0) {
    do {
      secp256k1_ge_verify((secp256k1_ge *)psVar70);
      secp256k1_fe_verify(psVar64);
      psVar64 = psVar64 + 1;
      psVar59 = psVar49 + -1;
      psVar49 = (secp256k1_gej *)&psVar59->field_0x97;
      psVar70 = (secp256k1_gej *)((psVar70->z).n + 1);
    } while (&psVar59->field_0x97 != (undefined1 *)0x0);
    puVar1 = &r_03[-1].field_0x97;
    psVar80 = (secp256k1_fe *)((long)&psVar56->y + (long)puVar1 * 0x68);
    secp256k1_fe_verify(psVar80);
    uVar46 = *(ulong *)((long)&psVar56->z + (long)puVar1 * 0x68 + -0x10);
    uVar48 = (uVar46 >> 0x30) * 0x1000003d1 + psVar80->n[0];
    uVar47 = (uVar48 >> 0x34) + *(long *)((long)&psVar56->y + (long)puVar1 * 0x68 + 8);
    uVar45 = (uVar47 >> 0x34) + *(long *)((long)&psVar56->y + (long)puVar1 * 0x68 + 0x10);
    uVar65 = (uVar45 >> 0x34) + *(long *)((long)&psVar56->y + (long)puVar1 * 0x68 + 0x18);
    psVar64 = (secp256k1_fe *)(uVar45 & 0xfffffffffffff);
    psVar80->n[0] = uVar48 & 0xfffffffffffff;
    *(ulong *)((long)&psVar56->y + (long)puVar1 * 0x68 + 8) = uVar47 & 0xfffffffffffff;
    *(secp256k1_fe **)((long)&psVar56->y + (long)puVar1 * 0x68 + 0x10) = psVar64;
    *(ulong *)((long)&psVar56->y + (long)puVar1 * 0x68 + 0x18) = uVar65 & 0xfffffffffffff;
    *(ulong *)((long)&psVar56->z + (long)puVar1 * 0x68 + -0x10) =
         (uVar65 >> 0x34) + (uVar46 & 0xffffffffffff);
    *(undefined4 *)((long)&psVar56->z + (long)puVar1 * 0x68 + -8) = 1;
    secp256k1_fe_verify(psVar80);
    sStack_988.n[0] = extraout_RDX_01[(long)puVar1].n[0];
    sStack_988.n[1] = extraout_RDX_01[(long)puVar1].n[1];
    sStack_988.n[2] = extraout_RDX_01[(long)puVar1].n[2];
    sStack_988.n[3] = (extraout_RDX_01[(long)puVar1].n + 2)[1];
    sStack_988.n[4] = extraout_RDX_01[(long)puVar1].n[4];
    sStack_988._40_8_ = (extraout_RDX_01[(long)puVar1].n + 4)[1];
    if (puVar1 != (undefined1 *)0x0) {
      psVar78 = (secp256k1_ge *)((long)psVar56 + (long)r_03 * 0x68 + -0xd0);
      psVar80 = extraout_RDX_01 + (long)r_03;
      puVar60 = (undefined1 *)0x0;
      do {
        psVar80 = psVar80 + -1;
        if (puVar60 != (undefined1 *)0x0) {
          psVar64 = &sStack_988;
          secp256k1_fe_mul(&sStack_988,&sStack_988,psVar80);
        }
        secp256k1_ge_verify(psVar78);
        r_04 = &sStack_988;
        secp256k1_fe_verify(&sStack_988);
        if (psVar78->infinity != 0) {
          secp256k1_ge_table_set_globalz_cold_1();
          secp256k1_scalar_verify(r_01);
          r_04->n[0] = r_01->d[0];
          r_04->n[1] = r_01->d[1];
          r_04->n[2] = 0;
          r_04->n[3] = 0;
          psVar64->n[0] = r_01->d[2];
          psVar64->n[1] = r_01->d[3];
          psVar64->n[2] = 0;
          psVar64->n[3] = 0;
          secp256k1_scalar_verify((secp256k1_scalar *)r_04);
          secp256k1_scalar_verify((secp256k1_scalar *)psVar64);
          return;
        }
        secp256k1_fe_sqr(&sStack_920,&sStack_988);
        secp256k1_fe_mul(&sStack_950,&sStack_920,&sStack_988);
        secp256k1_fe_mul(&psVar78->x,&psVar78->x,&sStack_920);
        psVar64 = &psVar78->y;
        secp256k1_fe_mul(psVar64,psVar64,&sStack_950);
        secp256k1_ge_verify(psVar78);
        puVar60 = puVar60 + 1;
        psVar78 = psVar78 + -1;
      } while (puVar1 != puVar60);
      if (r_03 == (secp256k1_gej *)0x0) {
        return;
      }
    }
    do {
      secp256k1_ge_verify((secp256k1_ge *)psVar56);
      psVar56 = (secp256k1_gej *)((psVar56->z).n + 1);
      r_03 = (secp256k1_gej *)&r_03[-1].field_0x97;
    } while (r_03 != (secp256k1_gej *)0x0);
  }
  return;
}

Assistant:

static void secp256k1_ecmult_strauss_wnaf(const struct secp256k1_strauss_state *state, secp256k1_gej *r, size_t num, const secp256k1_gej *a, const secp256k1_scalar *na, const secp256k1_scalar *ng) {
    secp256k1_ge tmpa;
    secp256k1_fe Z;
    /* Split G factors. */
    secp256k1_scalar ng_1, ng_128;
    int wnaf_ng_1[129];
    int bits_ng_1 = 0;
    int wnaf_ng_128[129];
    int bits_ng_128 = 0;
    int i;
    int bits = 0;
    size_t np;
    size_t no = 0;

    secp256k1_fe_set_int(&Z, 1);
    for (np = 0; np < num; ++np) {
        secp256k1_gej tmp;
        secp256k1_scalar na_1, na_lam;
        if (secp256k1_scalar_is_zero(&na[np]) || secp256k1_gej_is_infinity(&a[np])) {
            continue;
        }
        /* split na into na_1 and na_lam (where na = na_1 + na_lam*lambda, and na_1 and na_lam are ~128 bit) */
        secp256k1_scalar_split_lambda(&na_1, &na_lam, &na[np]);

        /* build wnaf representation for na_1 and na_lam. */
        state->ps[no].bits_na_1   = secp256k1_ecmult_wnaf(state->ps[no].wnaf_na_1,   129, &na_1,   WINDOW_A);
        state->ps[no].bits_na_lam = secp256k1_ecmult_wnaf(state->ps[no].wnaf_na_lam, 129, &na_lam, WINDOW_A);
        VERIFY_CHECK(state->ps[no].bits_na_1 <= 129);
        VERIFY_CHECK(state->ps[no].bits_na_lam <= 129);
        if (state->ps[no].bits_na_1 > bits) {
            bits = state->ps[no].bits_na_1;
        }
        if (state->ps[no].bits_na_lam > bits) {
            bits = state->ps[no].bits_na_lam;
        }

        /* Calculate odd multiples of a.
         * All multiples are brought to the same Z 'denominator', which is stored
         * in Z. Due to secp256k1' isomorphism we can do all operations pretending
         * that the Z coordinate was 1, use affine addition formulae, and correct
         * the Z coordinate of the result once at the end.
         * The exception is the precomputed G table points, which are actually
         * affine. Compared to the base used for other points, they have a Z ratio
         * of 1/Z, so we can use secp256k1_gej_add_zinv_var, which uses the same
         * isomorphism to efficiently add with a known Z inverse.
         */
        tmp = a[np];
        if (no) {
            secp256k1_gej_rescale(&tmp, &Z);
        }
        secp256k1_ecmult_odd_multiples_table(ECMULT_TABLE_SIZE(WINDOW_A), state->pre_a + no * ECMULT_TABLE_SIZE(WINDOW_A), state->aux + no * ECMULT_TABLE_SIZE(WINDOW_A), &Z, &tmp);
        if (no) secp256k1_fe_mul(state->aux + no * ECMULT_TABLE_SIZE(WINDOW_A), state->aux + no * ECMULT_TABLE_SIZE(WINDOW_A), &(a[np].z));

        ++no;
    }

    /* Bring them to the same Z denominator. */
    if (no) {
        secp256k1_ge_table_set_globalz(ECMULT_TABLE_SIZE(WINDOW_A) * no, state->pre_a, state->aux);
    }

    for (np = 0; np < no; ++np) {
        for (i = 0; i < ECMULT_TABLE_SIZE(WINDOW_A); i++) {
            secp256k1_fe_mul(&state->aux[np * ECMULT_TABLE_SIZE(WINDOW_A) + i], &state->pre_a[np * ECMULT_TABLE_SIZE(WINDOW_A) + i].x, &secp256k1_const_beta);
        }
    }

    if (ng) {
        /* split ng into ng_1 and ng_128 (where gn = gn_1 + gn_128*2^128, and gn_1 and gn_128 are ~128 bit) */
        secp256k1_scalar_split_128(&ng_1, &ng_128, ng);

        /* Build wnaf representation for ng_1 and ng_128 */
        bits_ng_1   = secp256k1_ecmult_wnaf(wnaf_ng_1,   129, &ng_1,   WINDOW_G);
        bits_ng_128 = secp256k1_ecmult_wnaf(wnaf_ng_128, 129, &ng_128, WINDOW_G);
        if (bits_ng_1 > bits) {
            bits = bits_ng_1;
        }
        if (bits_ng_128 > bits) {
            bits = bits_ng_128;
        }
    }

    secp256k1_gej_set_infinity(r);

    for (i = bits - 1; i >= 0; i--) {
        int n;
        secp256k1_gej_double_var(r, r, NULL);
        for (np = 0; np < no; ++np) {
            if (i < state->ps[np].bits_na_1 && (n = state->ps[np].wnaf_na_1[i])) {
                secp256k1_ecmult_table_get_ge(&tmpa, state->pre_a + np * ECMULT_TABLE_SIZE(WINDOW_A), n, WINDOW_A);
                secp256k1_gej_add_ge_var(r, r, &tmpa, NULL);
            }
            if (i < state->ps[np].bits_na_lam && (n = state->ps[np].wnaf_na_lam[i])) {
                secp256k1_ecmult_table_get_ge_lambda(&tmpa, state->pre_a + np * ECMULT_TABLE_SIZE(WINDOW_A), state->aux + np * ECMULT_TABLE_SIZE(WINDOW_A), n, WINDOW_A);
                secp256k1_gej_add_ge_var(r, r, &tmpa, NULL);
            }
        }
        if (i < bits_ng_1 && (n = wnaf_ng_1[i])) {
            secp256k1_ecmult_table_get_ge_storage(&tmpa, secp256k1_pre_g, n, WINDOW_G);
            secp256k1_gej_add_zinv_var(r, r, &tmpa, &Z);
        }
        if (i < bits_ng_128 && (n = wnaf_ng_128[i])) {
            secp256k1_ecmult_table_get_ge_storage(&tmpa, secp256k1_pre_g_128, n, WINDOW_G);
            secp256k1_gej_add_zinv_var(r, r, &tmpa, &Z);
        }
    }

    if (!r->infinity) {
        secp256k1_fe_mul(&r->z, &r->z, &Z);
    }
}